

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void RulePrint(FILE *fp,rule *rp,int iCursor)

{
  symbol *psVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  
  fprintf((FILE *)fp,"%s ::=",rp->lhs->name);
  uVar4 = (ulong)(uint)rp->nrhs;
  if (-1 < rp->nrhs) {
    uVar6 = 0;
    do {
      uVar3 = (uint)uVar4;
      if (uVar6 == (uint)iCursor) {
        fwrite(" *",2,1,(FILE *)fp);
        uVar3 = rp->nrhs;
      }
      if (uVar6 == uVar3) {
        return;
      }
      psVar1 = rp->rhs[uVar6];
      if (psVar1->type == MULTITERMINAL) {
        fprintf((FILE *)fp," %s",(*psVar1->subsym)->name);
        if (1 < psVar1->nsubsym) {
          lVar5 = 1;
          do {
            fprintf((FILE *)fp,"|%s",psVar1->subsym[lVar5]->name);
            lVar5 = lVar5 + 1;
          } while (lVar5 < psVar1->nsubsym);
        }
      }
      else {
        fprintf((FILE *)fp," %s",psVar1->name);
      }
      uVar4 = (ulong)rp->nrhs;
      bVar2 = (long)uVar6 < (long)uVar4;
      uVar6 = uVar6 + 1;
    } while (bVar2);
  }
  return;
}

Assistant:

void RulePrint(FILE *fp, struct rule *rp, int iCursor){
  struct symbol *sp;
  int i, j;
  fprintf(fp,"%s ::=",rp->lhs->name);
  for(i=0; i<=rp->nrhs; i++){
    if( i==iCursor ) fprintf(fp," *");
    if( i==rp->nrhs ) break;
    sp = rp->rhs[i];
    if( sp->type==MULTITERMINAL ){
      fprintf(fp," %s", sp->subsym[0]->name);
      for(j=1; j<sp->nsubsym; j++){
        fprintf(fp,"|%s",sp->subsym[j]->name);
      }
    }else{
      fprintf(fp," %s", sp->name);
    }
  }
}